

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O1

void __thiscall
bench::save(bench *this,ostream *os,string *name,
           vector<bench::element,_std::allocator<bench::element>_> *c)

{
  pointer pmVar1;
  pointer pcVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  basic_string_view<char> format_str;
  basic_string_view<char> format_str_00;
  basic_string_view<char> format_str_01;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  args;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  args_00;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  args_01;
  double local_78;
  size_type sStack_70;
  long local_68;
  vector<bench::element,_std::allocator<bench::element>_> *local_60;
  long local_58;
  string local_50;
  
  pcVar2 = (name->_M_dataplus)._M_p;
  local_60 = c;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar2,pcVar2 + name->_M_string_length);
  save_header(this,os,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  lVar3 = (long)(this->models).super__Vector_base<bench::model,_std::allocator<bench::model>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(this->models).super__Vector_base<bench::model,_std::allocator<bench::model>_>.
                _M_impl.super__Vector_impl_data._M_start;
  if (lVar3 != 0) {
    local_68 = (lVar3 >> 3) * -0x3333333333333333;
    lVar3 = 0;
    local_58 = 0;
    do {
      pmVar1 = (this->models).super__Vector_base<bench::model,_std::allocator<bench::model>_>.
               _M_impl.super__Vector_impl_data._M_start + local_58;
      local_78 = *(double *)&(pmVar1->m_name)._M_dataplus;
      sStack_70 = (pmVar1->m_name)._M_string_length;
      format_str.size_ = 3;
      format_str.data_ = "{},";
      args.field_1.values_ =
           (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)
           &local_78;
      args.desc_ = 0xd;
      ::fmt::v7::vprint<char>(os,format_str,args);
      lVar4 = (long)(this->solvers).
                    super__Vector_base<bench::solver,_std::allocator<bench::solver>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(this->solvers).
                    super__Vector_base<bench::solver,_std::allocator<bench::solver>_>._M_impl.
                    super__Vector_impl_data._M_start;
      if (lVar4 != 0) {
        lVar5 = 0;
        do {
          local_78 = *(double *)
                      ((long)(this->array).m_data.
                             super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start +
                      lVar5 * 8 + (this->array).m_line_size * lVar3);
          format_str_00.size_ = 8;
          format_str_00.data_ = "{:.10g},";
          args_00.field_1.values_ =
               (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                *)&local_78;
          args_00.desc_ = 10;
          ::fmt::v7::vprint<char>(os,format_str_00,args_00);
          lVar5 = lVar5 + 1;
        } while (lVar4 >> 5 != lVar5);
      }
      lVar4 = local_58;
      local_78 = (local_60->super__Vector_base<bench::element,_std::allocator<bench::element>_>).
                 _M_impl.super__Vector_impl_data._M_start[local_58].solution;
      format_str_01.size_ = 8;
      format_str_01.data_ = "{:.10g}\n";
      args_01.field_1.values_ =
           (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)
           &local_78;
      args_01.desc_ = 10;
      ::fmt::v7::vprint<char>(os,format_str_01,args_01);
      local_58 = lVar4 + 1;
      lVar3 = lVar3 + 8;
    } while (local_58 != local_68);
  }
  return;
}

Assistant:

void save(std::ostream& os,
              std::string name,
              const std::vector<element>& c)
    {
        save_header(os, name);

        for (std::size_t i{ 0 }, e{ models.size() }; i != e; ++i) {
            fmt::print(os, "{},", models[i].name());

            for (std::size_t j{ 0 }, end_j{ solvers.size() }; j != end_j; ++j)
                fmt::print(os, "{:.10g},", array(i, j));

            fmt::print(os, "{:.10g}\n", c[i].solution);
        }
    }